

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  buffer_appender<char> bVar12;
  int iVar13;
  uint uVar14;
  _Alloc_hider _Var15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  size_type sVar19;
  char *pcVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  buffer<char> *buf;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_2a8;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *local_288;
  long local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_2a8,(locale_ref)(this->locale).locale_);
  if (local_2a8._M_string_length == 0) {
    on_dec(this);
    goto LAB_001306b9;
  }
  cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar8 == '\0') {
    on_dec(this);
    goto LAB_001306b9;
  }
  uVar14 = this->abs_value;
  uVar22 = 0x1f;
  if ((uVar14 | 1) != 0) {
    for (; (uVar14 | 1) >> uVar22 == 0; uVar22 = uVar22 - 1) {
    }
  }
  uVar4 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar22 * 2);
  bVar7 = uVar14 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new + (ulong)uVar4 * 4);
  uVar21 = (uint)uVar4 - (uint)bVar7;
  _Var15._M_p = local_2a8._M_dataplus._M_p;
  uVar22 = uVar21;
  uVar9 = uVar21;
  if (local_2a8._M_string_length == 0) {
LAB_00130489:
    uVar10 = uVar9;
    uVar16 = uVar22;
    if (_Var15._M_p == local_2a8._M_dataplus._M_p + local_2a8._M_string_length) goto LAB_00130494;
  }
  else {
    uVar16 = uVar21 + (int)local_2a8._M_string_length;
    sVar19 = local_2a8._M_string_length;
    do {
      cVar2 = *_Var15._M_p;
      uVar10 = uVar9 - (int)cVar2;
      if ((uVar10 == 0 || (int)uVar9 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_00130489;
      uVar22 = uVar22 + 1;
      _Var15._M_p = _Var15._M_p + 1;
      sVar19 = sVar19 - 1;
      uVar9 = uVar10;
    } while (sVar19 != 0);
LAB_00130494:
    uVar16 = (int)(uVar10 - 1) / (int)(local_2a8._M_dataplus._M_p + local_2a8._M_string_length)[-1]
             + uVar16;
  }
  pcVar11 = local_278 + (int)uVar21;
  uVar22 = uVar14;
  if (99 < uVar14) {
    do {
      uVar14 = uVar22 / 100;
      *(undefined2 *)(pcVar11 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar22 % 100) * 2);
      pcVar11 = pcVar11 + -2;
      bVar6 = 9999 < uVar22;
      uVar22 = uVar22 / 100;
    } while (bVar6);
  }
  if (uVar14 < 10) {
    pcVar11[-1] = (byte)uVar14 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar11 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar14 * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0014ace0;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar16 = uVar16 + this->prefix_size;
  uVar23 = (ulong)uVar16;
  if (500 < uVar16) {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar23);
  }
  pcVar11 = local_248.super_buffer<char>.ptr_;
  local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
  if (uVar23 <= local_248.super_buffer<char>.capacity_) {
    local_248.super_buffer<char>.size_ = uVar23;
  }
  local_280 = (long)(int)uVar16;
  pcVar20 = local_248.super_buffer<char>.ptr_ + local_280 + -1;
  if (1 < (int)uVar21) {
    uVar17 = (ulong)uVar21;
    iVar18 = ((uint)uVar4 - (uint)bVar7) + 1;
    iVar13 = 0;
    _Var15._M_p = local_2a8._M_dataplus._M_p;
    do {
      uVar17 = uVar17 - 1;
      pcVar1 = pcVar20 + -1;
      *pcVar20 = local_278[uVar17 & 0xffffffff];
      cVar2 = *_Var15._M_p;
      if ('\0' < cVar2) {
        iVar13 = iVar13 + 1;
        if ((cVar2 != '\x7f') && (iVar13 % (int)cVar2 == 0)) {
          if (_Var15._M_p + 1 != local_2a8._M_dataplus._M_p + local_2a8._M_string_length) {
            iVar13 = 0;
            _Var15._M_p = _Var15._M_p + 1;
          }
          pcVar20[-1] = cVar8;
          pcVar1 = pcVar20 + -2;
        }
      }
      pcVar20 = pcVar1;
      iVar18 = iVar18 + -1;
    } while (2 < iVar18);
  }
  *pcVar20 = local_278[0];
  if (this->prefix_size != 0) {
    pcVar20[-1] = '-';
  }
  pbVar5 = this->specs;
  uVar17 = 0;
  if (uVar23 <= (uint)pbVar5->width) {
    uVar17 = (uint)pbVar5->width - uVar23;
  }
  bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                   (ulong)((byte)pbVar5->field_0x9 & 0xf));
  local_288 = this;
  if (*(ulong *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
               0x10) + uVar23 + (pbVar5->fill).size_ * uVar17) {
    (*(code *)**(undefined8 **)
                bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar23 = uVar17 >> (bVar3 & 0x3f);
  bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar12,uVar23,&pbVar5->fill);
  bVar12 = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                     (pcVar11,pcVar11 + local_280,bVar12);
  bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar12,uVar17 - uVar23,&pbVar5->fill);
  (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
  }
LAB_001306b9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }